

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void handle_splicing(token *word)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = word->data_size;
  if ((sVar3 != 0) && (uVar5 = sVar3 - 1, uVar5 != 0)) {
    uVar2 = 0;
    do {
      if ((word->data[uVar2] == '\\') && (word->data[uVar2 + 1] == '\n')) {
        if (sVar3 - 3 == uVar2) {
          return;
        }
        uVar4 = uVar2 + 2;
        while (uVar4 < uVar5) {
          pcVar1 = word->data;
          if ((pcVar1[uVar4] == '\\') && (pcVar1[uVar4 + 1] == '\n')) {
            uVar4 = uVar4 + 2;
          }
          else {
            pcVar1[uVar2] = pcVar1[uVar4];
            uVar4 = uVar4 + 1;
            uVar2 = uVar2 + 1;
            sVar3 = word->data_size;
          }
          uVar5 = sVar3 - 1;
        }
        word->data[uVar2] = word->data[uVar4];
        return;
      }
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void handle_splicing(struct token *word)
{
	size_t back;
	size_t front;
	if(word->data_size==0)
		return;
	front=0;
	for(front;front<word->data_size-1;++front)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
			break;
		}
	}
	if(front==word->data_size-1)
		return;

	for(back=front-2;front<word->data_size-1;)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
		}else
		{
			word->data[back]=word->data[front];
			++front;
			++back;
		}
	}
	word->data[back]=word->data[front];
}